

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O1

void ht_resize(ht_hash_table *ht,int base_size)

{
  ht_item *phVar1;
  ht_item **pphVar2;
  int iVar3;
  ht_hash_table *ht_00;
  long lVar4;
  
  if (base_size < 0x28) {
    return;
  }
  ht_00 = ht_new_sized(base_size);
  iVar3 = ht->size;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      phVar1 = ht->items[lVar4];
      if (phVar1 != &HT_DELETED_ITEM && phVar1 != (ht_item *)0x0) {
        ht_insert(ht_00,phVar1->key,phVar1->value);
      }
      lVar4 = lVar4 + 1;
      iVar3 = ht->size;
    } while (lVar4 < iVar3);
  }
  ht->base_size = ht_00->base_size;
  ht->count = ht_00->count;
  ht->size = ht_00->size;
  ht_00->size = iVar3;
  pphVar2 = ht->items;
  ht->items = ht_00->items;
  ht_00->items = pphVar2;
  ht_del_hash_table(ht_00);
  return;
}

Assistant:

static void ht_resize(ht_hash_table* ht, const int base_size) {
    if (base_size < HT_INITIAL_BASE_SIZE) {
        return;
    }

    ht_hash_table* new_ht = ht_new_sized(base_size);
    for (int i = 0; i < ht->size; i++) {
        ht_item* item = ht->items[i];
        if (item != nullptr && item != &HT_DELETED_ITEM) {
            ht_insert(new_ht, item->key, item->value);
        }
    }

    ht->base_size = new_ht->base_size;
    ht->count = new_ht->count;

    const int tmp_size = ht->size;
    ht->size = new_ht->size;
    new_ht->size = tmp_size;

    ht_item** tmp_items = ht->items;
    ht->items = new_ht->items;
    new_ht->items = tmp_items;
    ht_del_hash_table(new_ht);
}